

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O1

Geometry * __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::BoxIF,_int>_>::getGeometry
          (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::BoxIF,_int>_> *this,Box *dom)

{
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> _Var1
  ;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,__gnu_cxx::__ops::_Iter_equals_val<amrex::Box_const>>
                    ((this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish,dom);
  return (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
         super__Vector_impl_data._M_start +
         (int)((ulong)((long)_Var1._M_current -
                      (long)(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) * -0x49249249;
}

Assistant:

const Geometry&
IndexSpaceImp<G>::getGeometry (const Box& dom) const
{
    auto it = std::find(std::begin(m_domain), std::end(m_domain), dom);
    int i = std::distance(m_domain.begin(), it);
    return m_geom[i];
}